

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int test_dependOnContext(void)

{
  Context ctx;
  Context local_58;
  
  di::Context::Context(&local_58);
  di::Context::get<T11>(&local_58);
  di::Context::~Context(&local_58);
  return 1;
}

Assistant:

int test_dependOnContext()
{
    di::Context ctx;
    TINYTEST_STR_EQUAL( "A", ctx.get<T11>().run().c_str() );
    return 1;
}